

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.h
# Opt level: O0

cmCommand * __thiscall cmFunctionCommand::Clone(cmFunctionCommand *this)

{
  cmCommand *this_00;
  cmFunctionCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmFunctionCommand((cmFunctionCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmFunctionCommand;
    }